

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::encodeField(JsonCodec *this,Field field,Reader *input,Builder output)

{
  HandlerBase *pHVar1;
  Maybe<capnp::JsonCodec::HandlerBase_*const_&> MVar2;
  Type type;
  Reader local_c0;
  Reader local_78;
  
  MVar2 = kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
          find<capnp::StructSchema::Field&>
                    ((HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *)
                     &((this->impl).ptr)->fieldHandlers,&field);
  if (MVar2.ptr != (HandlerBase **)0x0) {
    pHVar1 = *MVar2.ptr;
    DynamicValue::Reader::Reader(&local_78,input);
    (**pHVar1->_vptr_HandlerBase)(pHVar1,this,&local_78);
    DynamicValue::Reader::~Reader(&local_78);
    if (MVar2.ptr != (HandlerBase **)0x0) {
      return;
    }
  }
  DynamicValue::Reader::Reader(&local_c0,input);
  type = StructSchema::Field::getType(&field);
  encode(this,&local_c0,type,output);
  DynamicValue::Reader::~Reader(&local_c0);
  return;
}

Assistant:

void JsonCodec::encodeField(StructSchema::Field field, DynamicValue::Reader input,
                            JsonValue::Builder output) const {
  KJ_IF_MAYBE(handler, impl->fieldHandlers.find(field)) {
    (*handler)->encodeBase(*this, input, output);
    return;
  }

  encode(input, field.getType(), output);
}